

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O0

wchar_t * c__next_word(wchar_t *p,wchar_t *high,wchar_t n,_func_wchar_t_wint_t *wtest)

{
  wchar_t wVar1;
  wchar_t wVar2;
  bool bVar3;
  _func_wchar_t_wint_t *wtest_local;
  wchar_t n_local;
  wchar_t *high_local;
  wchar_t *p_local;
  
  wtest_local._4_4_ = n;
  high_local = p;
  while (wVar2 = wtest_local._4_4_ + L'\xffffffff', wtest_local._4_4_ != L'\0') {
    while( true ) {
      bVar3 = false;
      if (high_local < high) {
        wVar1 = (*wtest)(*high_local);
        bVar3 = wVar1 == L'\0';
      }
      if (!bVar3) break;
      high_local = high_local + 1;
    }
    while( true ) {
      bVar3 = false;
      if (high_local < high) {
        wVar1 = (*wtest)(*high_local);
        bVar3 = wVar1 != L'\0';
      }
      wtest_local._4_4_ = wVar2;
      if (!bVar3) break;
      high_local = high_local + 1;
    }
  }
  if (high < high_local) {
    high_local = high;
  }
  return high_local;
}

Assistant:

libedit_private wchar_t *
c__next_word(wchar_t *p, wchar_t *high, int n, int (*wtest)(wint_t))
{
	while (n--) {
		while ((p < high) && !(*wtest)(*p))
			p++;
		while ((p < high) && (*wtest)(*p))
			p++;
	}
	if (p > high)
		p = high;
	/* p now points where we want it */
	return p;
}